

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O0

float NormedCustomLoss2(vector<INeuron_*,_std::allocator<INeuron_*>_> *outputNeurons,Target classId,
                       vector<float,_std::allocator<float>_> *deltas)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  reference ppIVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference ppIVar7;
  reference pvVar8;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *pvVar9;
  float extraout_XMM0_Da;
  double dVar10;
  float local_90;
  float local_84;
  int local_78;
  float local_74;
  int neuronId_1;
  float local_6c;
  float output;
  float target;
  INeuron *neuron_1;
  INeuron *pIStack_58;
  int neuronId;
  INeuron *neuron;
  const_iterator __end1;
  const_iterator __begin1;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *__range1;
  ulong uStack_30;
  float s;
  size_t maxSpikes;
  float loss;
  vector<float,_std::allocator<float>_> *deltas_local;
  Target classId_local;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *outputNeurons_local;
  
  maxSpikes._4_4_ = 0.0;
  uStack_30 = 0;
  __range1._4_4_ = 0.0;
  __end1 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::begin(outputNeurons);
  neuron = (INeuron *)std::vector<INeuron_*,_std::allocator<INeuron_*>_>::end(outputNeurons);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<INeuron_*const_*,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>
                                     *)&neuron), bVar2) {
    ppIVar4 = __gnu_cxx::
              __normal_iterator<INeuron_*const_*,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>
              ::operator*(&__end1);
    pIStack_58 = *ppIVar4;
    iVar3 = INeuron::GetOutputSpikeCounter(pIStack_58);
    if (uStack_30 < (ulong)(long)iVar3) {
      iVar3 = INeuron::GetOutputSpikeCounter(pIStack_58);
      uStack_30 = (ulong)iVar3;
    }
    __gnu_cxx::
    __normal_iterator<INeuron_*const_*,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>::
    operator++(&__end1);
  }
  for (neuron_1._4_4_ = 0; uVar5 = (ulong)neuron_1._4_4_,
      sVar6 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::size(outputNeurons), uVar5 < sVar6
      ; neuron_1._4_4_ = neuron_1._4_4_ + 1) {
    pvVar9 = outputNeurons;
    ppIVar7 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::operator[]
                        (outputNeurons,(long)neuron_1._4_4_);
    _output = *ppIVar7;
    std::abs((int)pvVar9);
    local_6c = (float)(-(uint)(extraout_XMM0_Da < 1e-05) & 0x3f800000);
    if (uStack_30 == 0) {
      local_90 = 0.0;
    }
    else {
      iVar3 = INeuron::GetOutputSpikeCounter(_output);
      local_84 = (float)uStack_30;
      local_90 = (float)iVar3 / local_84;
    }
    neuronId_1 = (int)local_90;
    local_74 = local_90 - local_6c;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(deltas,&local_74);
    pvVar8 = std::vector<float,_std::allocator<float>_>::back(deltas);
    fVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::back(deltas);
    __range1._4_4_ = fVar1 * *pvVar8 + __range1._4_4_;
  }
  dVar10 = std::sqrt((double)(ulong)(uint)__range1._4_4_);
  if (1e-05 < SUB84(dVar10,0)) {
    for (local_78 = 0;
        sVar6 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::size(outputNeurons),
        (ulong)(long)local_78 < sVar6; local_78 = local_78 + 1) {
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](deltas,(long)local_78);
      fVar1 = *pvVar8;
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](deltas,(long)local_78);
      *pvVar8 = fVar1 / SUB84(dVar10,0);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](deltas,(long)local_78);
      fVar1 = *pvVar8;
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](deltas,(long)local_78);
      maxSpikes._4_4_ = fVar1 * *pvVar8 * 0.5 + maxSpikes._4_4_;
    }
  }
  return -maxSpikes._4_4_;
}

Assistant:

float
NormedCustomLoss2( const std::vector<INeuron *> &outputNeurons, SPIKING_NN::Target classId, std::vector<float> &deltas )
{
    float loss = 0;
    size_t maxSpikes = 0;
    float s = 0;
    for ( auto neuron: outputNeurons ) {
        if ( neuron->GetOutputSpikeCounter() > maxSpikes ) {
            maxSpikes = neuron->GetOutputSpikeCounter();
        }
    }
    for ( int neuronId = 0; neuronId < outputNeurons.size(); neuronId++ ) {
        INeuron *neuron = outputNeurons[neuronId];
        auto target = static_cast<float>( abs( classId - neuronId ) < SPIKING_NN::EPS );
        float output = maxSpikes ? static_cast<float>(neuron->GetOutputSpikeCounter()) / maxSpikes : 0;
        deltas.emplace_back( output - target );
        s += deltas.back() * deltas.back();
    }
    s = sqrt( s );
    if ( s > SPIKING_NN::EPS ) {
        for ( int neuronId = 0; neuronId < outputNeurons.size(); neuronId++ ) {
            deltas[neuronId] = deltas[neuronId] / s;
            loss += 0.5 * ( deltas[neuronId] * deltas[neuronId] );
        }
    }
    return -loss;
}